

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

DP_WSR_Stream
DummyInitWriterPerReader
          (CP_Services Svcs,DP_WS_Stream WS_Stream_v,int readerCohortSize,CP_PeerCohort PeerCohort,
          void **providedReaderInfo_v,void **WriterContactInfoPtr)

{
  long *plVar1;
  char *__s;
  void *pvVar2;
  char *pcVar3;
  undefined8 *__s_00;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  int i;
  DummyReaderContactInfo *providedReaderInfo;
  char *DummyContactString;
  int Rank;
  SMPI_Comm comm;
  DummyWriterContactInfo ContactInfo;
  Dummy_WSR_Stream WSR_Stream;
  Dummy_WS_Stream WS_Stream;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  uint local_54;
  
  plVar1 = (long *)malloc(0x20);
  (*(code *)in_RDI[3])(*(undefined8 *)(in_RSI + 8));
  __s = (char *)malloc(0x40);
  SMPI_Comm_rank((SMPI_Comm)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
  snprintf(__s,0x40,"Writer Rank %d, test contact",(ulong)local_54);
  *plVar1 = in_RSI;
  plVar1[1] = in_RCX;
  pvVar2 = malloc((long)in_EDX << 4);
  plVar1[3] = (long)pvVar2;
  for (iVar4 = 0; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
    pcVar3 = strdup((char *)**(undefined8 **)(in_R8 + (long)iVar4 * 8));
    *(char **)(plVar1[3] + (long)iVar4 * 0x10) = pcVar3;
    *(undefined8 *)(plVar1[3] + (long)iVar4 * 0x10 + 8) =
         *(undefined8 *)(*(long *)(in_R8 + (long)iVar4 * 8) + 8);
    (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 8),5,
                       "Received contact info \"%s\", RD_Stream %p for Reader Rank %d\n",
                       *(undefined8 *)(plVar1[3] + (long)iVar4 * 0x10),
                       *(undefined8 *)(plVar1[3] + (long)iVar4 * 0x10 + 8),iVar4);
  }
  pvVar2 = realloc(*(void **)(in_RSI + 0x30),(long)(*(int *)(in_RSI + 0x28) + 1) << 5);
  *(void **)(in_RSI + 0x30) = pvVar2;
  *(long **)(*(long *)(in_RSI + 0x30) + (long)*(int *)(in_RSI + 0x28) * 8) = plVar1;
  *(int *)(in_RSI + 0x28) = *(int *)(in_RSI + 0x28) + 1;
  __s_00 = (undefined8 *)malloc(0x10);
  memset(__s_00,0,0x10);
  *__s_00 = __s;
  __s_00[1] = plVar1;
  *in_R9 = __s_00;
  return plVar1;
}

Assistant:

static DP_WSR_Stream DummyInitWriterPerReader(CP_Services Svcs, DP_WS_Stream WS_Stream_v,
                                              int readerCohortSize, CP_PeerCohort PeerCohort,
                                              void **providedReaderInfo_v,
                                              void **WriterContactInfoPtr)
{
    Dummy_WS_Stream WS_Stream = (Dummy_WS_Stream)WS_Stream_v;
    Dummy_WSR_Stream WSR_Stream = malloc(sizeof(*WSR_Stream));
    DummyWriterContactInfo ContactInfo;
    SMPI_Comm comm = Svcs->getMPIComm(WS_Stream->CP_Stream);
    int Rank;
    char *DummyContactString = malloc(64);
    DummyReaderContactInfo *providedReaderInfo = (DummyReaderContactInfo *)providedReaderInfo_v;

    SMPI_Comm_rank(comm, &Rank);
    snprintf(DummyContactString, 64, "Writer Rank %d, test contact", Rank);

    WSR_Stream->WS_Stream = WS_Stream; /* pointer to writer struct */
    WSR_Stream->PeerCohort = PeerCohort;

    /*
     * make a copy of writer contact information (original will not be
     * preserved)
     */
    WSR_Stream->ReaderContactInfo =
        malloc(sizeof(struct _DummyReaderContactInfo) * readerCohortSize);
    for (int i = 0; i < readerCohortSize; i++)
    {
        WSR_Stream->ReaderContactInfo[i].ContactString =
            strdup(providedReaderInfo[i]->ContactString);
        WSR_Stream->ReaderContactInfo[i].RS_Stream = providedReaderInfo[i]->RS_Stream;
        Svcs->verbose(WS_Stream->CP_Stream, DPTraceVerbose,
                      "Received contact info \"%s\", RD_Stream %p for Reader Rank %d\n",
                      WSR_Stream->ReaderContactInfo[i].ContactString,
                      WSR_Stream->ReaderContactInfo[i].RS_Stream, i);
    }

    /*
     * add this writer-side reader-specific stream to the parent writer stream
     * structure
     */
    WS_Stream->Readers =
        realloc(WS_Stream->Readers, sizeof(*WSR_Stream) * (WS_Stream->ReaderCount + 1));
    WS_Stream->Readers[WS_Stream->ReaderCount] = WSR_Stream;
    WS_Stream->ReaderCount++;

    ContactInfo = malloc(sizeof(struct _DummyWriterContactInfo));
    memset(ContactInfo, 0, sizeof(struct _DummyWriterContactInfo));
    ContactInfo->ContactString = DummyContactString;
    ContactInfo->WS_Stream = WSR_Stream;
    *WriterContactInfoPtr = ContactInfo;

    return WSR_Stream;
}